

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteInstruction.cpp
# Opt level: O0

int do_dec(void)

{
  uint *puVar1;
  byte bVar2;
  byte bVar3;
  undefined4 *puVar4;
  uint *Ra_2;
  int16_t *Ra_1;
  char *Ra;
  uint8_t low;
  uint8_t high;
  
  bVar2 = (byte)code_ptr[registe_ptr->IP + 1] >> 4;
  bVar3 = code_ptr[registe_ptr->IP + 1] & 0xf;
  if (bVar3 == 0) {
    puVar1 = register_list[bVar2];
    *(char *)puVar1 = (char)*puVar1 + -1;
    set_flag((char)*puVar1);
  }
  else if (bVar3 == 1) {
    puVar1 = register_list[bVar2];
    *(short *)puVar1 = (short)*puVar1 + -1;
    set_flag((int16_t)*puVar1);
  }
  else {
    if (bVar3 != 2) {
      puVar4 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar4 = 0xf6;
      __cxa_throw(puVar4,&int::typeinfo,0);
    }
    puVar1 = register_list[bVar2];
    *puVar1 = *puVar1 - 1;
    set_flag(*puVar1);
  }
  return 1;
}

Assistant:

int do_dec() {
	uint8_t high = (uint8_t)code_ptr[registe_ptr->IP + 1] / 0x10;
	uint8_t low = (uint8_t)code_ptr[registe_ptr->IP + 1] % 0x10;
	switch (low)
	{
	case 0: {
		char*Ra = (char *)register_list[high];
		--*Ra;
		set_flag(*Ra);
		break;
	}
	case 1: {
		int16_t *Ra = (int16_t *)register_list[high];
		--*Ra;
		set_flag(*Ra);
		break;
	}
	case 2: {
		unsigned *Ra = (unsigned *)register_list[high];
		--*Ra;
		set_flag(*Ra);
		break;
	}
	default:
	{
		throw(LVM_EXECUTE_ERROR);
		break;
	}
	}
	return LVM_SUCCESS;
}